

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfragmentmap_p.h
# Opt level: O1

uint __thiscall
QFragmentMapData<QTextBlockData>::erase_single(QFragmentMapData<QTextBlockData> *this,uint z)

{
  quint32 *pqVar1;
  uint uVar2;
  undefined4 uVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  ulong uVar10;
  Header *pHVar11;
  int *piVar12;
  ulong uVar13;
  ulong uVar14;
  uint *puVar15;
  long lVar16;
  ulong uVar17;
  uint field;
  long lVar18;
  ulong uVar19;
  
  uVar8 = (ulong)z;
  uVar6 = previous(this,z);
  pHVar11 = (this->field_0).head;
  puVar15 = (uint *)((long)pHVar11 + uVar8 * 0x48 + 8);
  uVar14 = (ulong)*(uint *)((long)pHVar11 + uVar8 * 0x48 + 4);
  uVar10 = uVar8;
  if (uVar14 != 0) {
    if (*puVar15 == 0) {
      puVar15 = (uint *)((long)pHVar11 + uVar8 * 0x48 + 4);
    }
    else {
      do {
        uVar10 = (ulong)*puVar15;
        puVar15 = (uint *)((long)pHVar11 + uVar10 * 0x48 + 4);
      } while (*puVar15 != 0);
      puVar15 = (uint *)((long)pHVar11 + uVar10 * 0x48 + 8);
    }
  }
  uVar7 = *puVar15;
  uVar19 = (ulong)uVar7;
  uVar9 = (uint)uVar10;
  if (uVar9 == z) {
    uVar2 = *(uint *)((long)pHVar11 + uVar8 * 0x48);
    uVar14 = (ulong)uVar2;
    if (uVar7 != 0) {
      *(uint *)((long)pHVar11 + uVar19 * 0x48) = uVar2;
    }
    pHVar11 = (this->field_0).head;
    if (uVar2 == 0) {
      pHVar11->root = uVar7;
      uVar14 = 0;
    }
    else if (*(uint *)((long)pHVar11 + uVar14 * 0x48 + 4) == z) {
      *(uint *)((long)pHVar11 + uVar14 * 0x48 + 4) = uVar7;
      lVar16 = 0;
      do {
        piVar12 = (int *)((long)(this->field_0).head + lVar16 * 4 + uVar14 * 0x48 + 0x10);
        *piVar12 = *piVar12 -
                   *(int *)((long)(this->field_0).head + lVar16 * 4 + uVar8 * 0x48 + 0x1c);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 3);
    }
    else {
      *(uint *)((long)pHVar11 + uVar14 * 0x48 + 8) = uVar7;
    }
  }
  else {
    *(uint *)((long)pHVar11 + uVar14 * 0x48) = uVar9;
    lVar16 = uVar8 * 0x48;
    lVar4 = uVar10 * 0x48;
    *(undefined4 *)((long)(this->field_0).head + lVar4 + 4) =
         *(undefined4 *)((long)(this->field_0).head + lVar16 + 4);
    lVar18 = 0;
    do {
      *(undefined4 *)((long)(this->field_0).head + lVar18 * 4 + lVar4 + 0x10) =
           *(undefined4 *)((long)(this->field_0).head + lVar18 * 4 + lVar16 + 0x10);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    pHVar11 = (this->field_0).head;
    uVar14 = uVar10;
    if (uVar9 != *(uint *)((long)pHVar11 + uVar8 * 0x48 + 8)) {
      uVar2 = *(uint *)((long)pHVar11 + uVar10 * 0x48);
      uVar14 = (ulong)uVar2;
      if (uVar7 != 0) {
        *(uint *)((long)pHVar11 + uVar19 * 0x48) = uVar2;
      }
      *(uint *)((long)(this->field_0).head + uVar14 * 0x48 + 4) = uVar7;
      *(undefined4 *)((long)(this->field_0).head + uVar10 * 0x48 + 8) =
           *(undefined4 *)((long)(this->field_0).head + lVar16 + 8);
      *(uint *)((long)(this->field_0).head +
               (ulong)*(uint *)((long)(this->field_0).head + lVar16 + 8) * 0x48) = uVar9;
      if (uVar2 != uVar9) {
        uVar13 = uVar14;
        do {
          lVar18 = 0;
          do {
            piVar12 = (int *)((long)(this->field_0).head + lVar18 * 4 + uVar13 * 0x48 + 0x10);
            *piVar12 = *piVar12 -
                       *(int *)((long)(this->field_0).head + lVar18 * 4 + uVar10 * 0x48 + 0x1c);
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          uVar7 = *(uint *)((long)(this->field_0).head + uVar13 * 0x48);
          uVar13 = (ulong)uVar7;
        } while (uVar7 != uVar9);
      }
    }
    pHVar11 = (this->field_0).head;
    uVar7 = *(uint *)((long)pHVar11 + uVar8 * 0x48);
    uVar10 = (ulong)uVar7;
    if (uVar10 == 0) {
      pHVar11->root = uVar9;
    }
    else if (*(uint *)((long)pHVar11 + uVar10 * 0x48 + 4) == z) {
      *(uint *)((long)pHVar11 + uVar10 * 0x48 + 4) = uVar9;
      lVar18 = 0;
      do {
        piVar12 = (int *)((long)(this->field_0).head + lVar18 * 4 + uVar10 * 0x48 + 0x10);
        *piVar12 = *piVar12 -
                   *(int *)((long)(this->field_0).head + lVar18 * 4 + uVar8 * 0x48 + 0x1c);
        lVar18 = lVar18 + 1;
      } while (lVar18 != 3);
    }
    else {
      *(uint *)((long)pHVar11 + uVar10 * 0x48 + 8) = uVar9;
    }
    *(uint *)((long)(this->field_0).head + lVar4) = uVar7;
    pHVar11 = (this->field_0).head;
    uVar3 = *(undefined4 *)((long)pHVar11 + lVar4 + 0xc);
    *(undefined4 *)((long)pHVar11 + lVar4 + 0xc) = *(undefined4 *)((long)pHVar11 + lVar16 + 0xc);
    *(undefined4 *)((long)(this->field_0).head + lVar16 + 0xc) = uVar3;
    uVar9 = z;
  }
  pHVar11 = (this->field_0).head;
  uVar7 = *(uint *)((long)pHVar11 + uVar8 * 0x48);
  if (uVar7 != 0) {
    uVar10 = uVar8;
    do {
      uVar13 = (ulong)uVar7;
      uVar17 = (ulong)uVar7;
      if (*(int *)((long)pHVar11 + uVar17 * 0x48 + 4) == (int)uVar10) {
        lVar16 = 0;
        do {
          piVar12 = (int *)((long)(this->field_0).head + lVar16 * 4 + uVar17 * 0x48 + 0x10);
          *piVar12 = *piVar12 -
                     *(int *)((long)(this->field_0).head + lVar16 * 4 + uVar8 * 0x48 + 0x1c);
          lVar16 = lVar16 + 1;
        } while (lVar16 != 3);
      }
      pHVar11 = (this->field_0).head;
      uVar7 = *(uint *)((long)pHVar11 + uVar17 * 0x48);
      uVar10 = uVar13;
    } while (uVar7 != 0);
  }
  *(quint32 *)((long)pHVar11 + uVar8 * 0x48 + 8) = pHVar11->freelist;
  ((this->field_0).head)->freelist = z;
  pqVar1 = &((this->field_0).head)->node_count;
  *pqVar1 = *pqVar1 - 1;
  if (*(int *)((long)(this->field_0).head + (ulong)uVar9 * 0x48 + 0xc) != 0) {
    pHVar11 = (this->field_0).head;
    if (*(int *)((long)pHVar11 + uVar19 * 0x48) != 0) {
      piVar12 = (int *)((long)pHVar11 + uVar19 * 0x48);
      do {
        if (((uint)uVar19 != 0) && (piVar12[3] != 1)) break;
        uVar9 = (uint)uVar14;
        uVar7 = *(uint *)((long)pHVar11 + uVar14 * 0x48 + 4);
        uVar8 = (ulong)uVar7;
        if ((uint)uVar19 == uVar7) {
          uVar8 = (ulong)*(uint *)((long)pHVar11 + uVar14 * 0x48 + 8);
          if (*(int *)((long)pHVar11 + uVar8 * 0x48 + 0xc) == 0) {
            *(undefined4 *)((long)pHVar11 + uVar8 * 0x48 + 0xc) = 1;
            *(undefined4 *)((long)(this->field_0).head + uVar14 * 0x48 + 0xc) = 0;
            rotateLeft(this,uVar9);
            uVar8 = (ulong)*(uint *)((long)(this->field_0).head + uVar14 * 0x48 + 8);
          }
          pHVar11 = (this->field_0).head;
          uVar7 = (uint)uVar8;
          lVar16 = (long)pHVar11 + uVar8 * 0x48;
          uVar10 = (ulong)*(uint *)(lVar16 + 4);
          if (((uVar10 == 0) || (*(int *)((long)pHVar11 + uVar10 * 0x48 + 0xc) == 1)) &&
             (((ulong)*(uint *)(lVar16 + 8) == 0 ||
              (*(int *)((long)pHVar11 + (ulong)*(uint *)(lVar16 + 8) * 0x48 + 0xc) == 1))))
          goto LAB_004e0e4d;
          if (((ulong)*(uint *)(lVar16 + 8) == 0) ||
             (*(int *)((long)pHVar11 + (ulong)*(uint *)(lVar16 + 8) * 0x48 + 0xc) == 1)) {
            if (uVar10 != 0) {
              *(undefined4 *)((long)pHVar11 + uVar10 * 0x48 + 0xc) = 1;
            }
            *(undefined4 *)((long)(this->field_0).head + uVar8 * 0x48 + 0xc) = 0;
            rotateRight(this,*(uint *)((long)(this->field_0).head + uVar14 * 0x48 + 8));
            uVar7 = *(uint *)((long)(this->field_0).head + uVar14 * 0x48 + 8);
          }
          *(undefined4 *)((long)(this->field_0).head + (ulong)uVar7 * 0x48 + 0xc) =
               *(undefined4 *)((long)(this->field_0).head + uVar14 * 0x48 + 0xc);
          *(undefined4 *)((long)(this->field_0).head + uVar14 * 0x48 + 0xc) = 1;
          uVar8 = (ulong)*(uint *)((long)(this->field_0).head + (ulong)uVar7 * 0x48 + 8);
          if (uVar8 != 0) {
            *(undefined4 *)((long)(this->field_0).head + uVar8 * 0x48 + 0xc) = 1;
          }
          rotateLeft(this,uVar9);
LAB_004e0f04:
          bVar5 = false;
        }
        else {
          if (*(int *)((long)pHVar11 + uVar8 * 0x48 + 0xc) == 0) {
            *(undefined4 *)((long)pHVar11 + uVar8 * 0x48 + 0xc) = 1;
            *(undefined4 *)((long)(this->field_0).head + uVar14 * 0x48 + 0xc) = 0;
            rotateRight(this,uVar9);
            uVar8 = (ulong)*(uint *)((long)(this->field_0).head + uVar14 * 0x48 + 4);
          }
          pHVar11 = (this->field_0).head;
          uVar7 = (uint)uVar8;
          lVar16 = (long)pHVar11 + uVar8 * 0x48;
          uVar10 = (ulong)*(uint *)(lVar16 + 8);
          if (((uVar10 != 0) && (*(int *)((long)pHVar11 + uVar10 * 0x48 + 0xc) != 1)) ||
             (((ulong)*(uint *)(lVar16 + 4) != 0 &&
              (*(int *)((long)pHVar11 + (ulong)*(uint *)(lVar16 + 4) * 0x48 + 0xc) != 1)))) {
            if (((ulong)*(uint *)(lVar16 + 4) == 0) ||
               (*(int *)((long)pHVar11 + (ulong)*(uint *)(lVar16 + 4) * 0x48 + 0xc) == 1)) {
              if (uVar10 != 0) {
                *(undefined4 *)((long)pHVar11 + uVar10 * 0x48 + 0xc) = 1;
              }
              *(undefined4 *)((long)(this->field_0).head + uVar8 * 0x48 + 0xc) = 0;
              rotateLeft(this,*(uint *)((long)(this->field_0).head + uVar14 * 0x48 + 4));
              uVar7 = *(uint *)((long)(this->field_0).head + uVar14 * 0x48 + 4);
            }
            *(undefined4 *)((long)(this->field_0).head + (ulong)uVar7 * 0x48 + 0xc) =
                 *(undefined4 *)((long)(this->field_0).head + uVar14 * 0x48 + 0xc);
            *(undefined4 *)((long)(this->field_0).head + uVar14 * 0x48 + 0xc) = 1;
            uVar8 = (ulong)*(uint *)((long)(this->field_0).head + (ulong)uVar7 * 0x48 + 4);
            if (uVar8 != 0) {
              *(undefined4 *)((long)(this->field_0).head + uVar8 * 0x48 + 0xc) = 1;
            }
            rotateRight(this,uVar9);
            goto LAB_004e0f04;
          }
LAB_004e0e4d:
          *(undefined4 *)(lVar16 + 0xc) = 0;
          uVar9 = *(uint *)((long)(this->field_0).head + uVar14 * 0x48);
          bVar5 = true;
          uVar19 = uVar14;
        }
        if (!bVar5) break;
        pHVar11 = (this->field_0).head;
        piVar12 = (int *)((long)pHVar11 + uVar19 * 0x48);
        uVar14 = (ulong)uVar9;
      } while (*piVar12 != 0);
    }
    if ((int)uVar19 != 0) {
      *(undefined4 *)((long)(this->field_0).head + uVar19 * 0x48 + 0xc) = 1;
    }
  }
  return uVar6;
}

Assistant:

uint QFragmentMapData<Fragment>::erase_single(uint z)
{
    uint w = previous(z);
    uint y = z;
    uint x;
    uint p;

    if (!F(y).left) {
        x = F(y).right;
    } else if (!F(y).right) {
        x = F(y).left;
    } else {
        y = F(y).right;
        while (F(y).left)
            y = F(y).left;
        x = F(y).right;
    }

    if (y != z) {
        F(F(z).left).parent = y;
        F(y).left = F(z).left;
        for (uint field = 0; field < Fragment::size_array_max; ++field)
            F(y).size_left_array[field] = F(z).size_left_array[field];
        if (y != F(z).right) {
            /*
                     z                y
                    / \              / \
                   a   b            a   b
                      /                /
                    ...     -->      ...
                    /                /
                   y                x
                  / \
                 0   x
             */
            p = F(y).parent;
            if (x)
                F(x).parent = p;
            F(p).left = x;
            F(y).right = F(z).right;
            F(F(z).right).parent = y;
            uint n = p;
            while (n != y) {
                for (uint field = 0; field < Fragment::size_array_max; ++field)
                    F(n).size_left_array[field] -= F(y).size_array[field];
                n = F(n).parent;
            }
        } else {
            /*
                     z                y
                    / \              / \
                   a   y     -->    a   x
                      / \
                     0   x
             */
            p = y;
        }
        uint zp = F(z).parent;
        if (!zp) {
            Q_ASSERT(head->root == z);
            head->root = y;
        } else if (F(zp).left == z) {
            F(zp).left = y;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(zp).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(zp).right = y;
        }
        F(y).parent = zp;
        // Swap the colors
        uint c = F(y).color;
        F(y).color = F(z).color;
        F(z).color = c;
        y = z;
    } else {
        /*
                p          p            p          p
               /          /              \          \
              z    -->   x                z  -->     x
              |                           |
              x                           x
         */
        p = F(z).parent;
        if (x)
            F(x).parent = p;
        if (!p) {
            Q_ASSERT(head->root == z);
            head->root = x;
        } else if (F(p).left == z) {
            F(p).left = x;
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        } else {
            F(p).right = x;
        }
    }
    uint n = z;
    while (F(n).parent) {
        uint p = F(n).parent;
        if (F(p).left == n) {
            for (uint field = 0; field < Fragment::size_array_max; ++field)
                F(p).size_left_array[field] -= F(z).size_array[field];
        }
        n = p;
    }

    freeFragment(z);


    if (F(y).color != Red) {
        while (F(x).parent && (x == 0 || F(x).color == Black)) {
            if (x == F(p).left) {
                uint w = F(p).right;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateLeft(p);
                    w = F(p).right;
                }
                if ((F(w).left == 0 || F(F(w).left).color == Black) &&
                    (F(w).right == 0 || F(F(w).right).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).right == 0 || F(F(w).right).color == Black) {
                        if (F(w).left)
                            F(F(w).left).color = Black;
                        F(w).color = Red;
                        rotateRight(F(p).right);
                        w = F(p).right;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).right)
                        F(F(w).right).color = Black;
                    rotateLeft(p);
                    break;
                }
            } else {
                uint w = F(p).left;
                if (F(w).color == Red) {
                    F(w).color = Black;
                    F(p).color = Red;
                    rotateRight(p);
                    w = F(p).left;
                }
                if ((F(w).right == 0 || F(F(w).right).color == Black) &&
                    (F(w).left == 0 || F(F(w).left).color == Black)) {
                    F(w).color = Red;
                    x = p;
                    p = F(x).parent;
                } else {
                    if (F(w).left == 0 || F(F(w).left).color == Black) {
                        if (F(w).right)
                            F(F(w).right).color = Black;
                        F(w).color = Red;
                        rotateLeft(F(p).left);
                        w = F(p).left;
                    }
                    F(w).color = F(p).color;
                    F(p).color = Black;
                    if (F(w).left)
                        F(F(w).left).color = Black;
                    rotateRight(p);
                    break;
                }
            }
        }
        if (x)
            F(x).color = Black;
    }

    return w;
}